

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall Server::process_connections(Server *this)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (this->connections).super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->connections) {
    do {
      Connection::exchange_data((Connection *)p_Var1[1]._M_next,&this->rdfds,&this->wrfds);
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&this->connections);
  }
  return;
}

Assistant:

void Server::process_connections() {
    for (auto i = connections.begin(); i != connections.end(); ++i) {
        (*i)->exchange_data(rdfds, wrfds);
    }
}